

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * push_data(string *e)

{
  string *this;
  size_type sVar1;
  reference ppbVar2;
  string *local_18;
  string *local_10;
  string *e_local;
  
  local_10 = (string *)e;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,local_10);
  local_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::push_back(&v_str_abi_cxx11_,(value_type *)&local_18);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
          ::size(&v_str_abi_cxx11_);
  ppbVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::operator[](&v_str_abi_cxx11_,sVar1 - 1);
  return *ppbVar2;
}

Assistant:

std::string* push_data(const std::string& e)
{
	v_str.push_back(new std::string(e));
	return v_str[v_str.size() - 1];
}